

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

Result<wallet::SelectionResult> * wallet::ErrorMaxWeightExceeded(void)

{
  long *in_RDI;
  long in_FS_OFFSET;
  char *local_70;
  undefined4 *local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Result<wallet::SelectionResult> *local_28;
  
  local_28 = *(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28);
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
             ,"");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
               ,"");
  }
  else {
    local_70 = 
    "The inputs size exceeds the maximum weight. Please try sending a smaller amount or manually consolidating your wallet\'s UTXOs"
    ;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_48,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_70);
  }
  *in_RDI = (long)(in_RDI + 2);
  if (local_68 == &local_58) {
    *(undefined4 *)(in_RDI + 2) = local_58;
    *(undefined4 *)((long)in_RDI + 0x14) = uStack_54;
    *(undefined4 *)(in_RDI + 3) = uStack_50;
    *(undefined4 *)((long)in_RDI + 0x1c) = uStack_4c;
  }
  else {
    *in_RDI = (long)local_68;
    in_RDI[2] = CONCAT44(uStack_54,local_58);
  }
  in_RDI[1] = local_60;
  in_RDI[4] = (long)(in_RDI + 6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    *(undefined4 *)(in_RDI + 6) = local_48.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)in_RDI + 0x34) = local_48.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(in_RDI + 7) = local_48.field_2._8_4_;
    *(undefined4 *)((long)in_RDI + 0x3c) = local_48.field_2._12_4_;
  }
  else {
    in_RDI[4] = (long)local_48._M_dataplus._M_p;
    in_RDI[6] = CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                         local_48.field_2._M_allocated_capacity._0_4_);
  }
  in_RDI[5] = local_48._M_string_length;
  *(undefined1 *)(in_RDI + 0xe) = 0;
  if (*(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> ErrorMaxWeightExceeded()
{
    return util::Error{_("The inputs size exceeds the maximum weight. "
                         "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
}